

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgnometheme.cpp
# Opt level: O0

void __thiscall QGnomeThemePrivate::~QGnomeThemePrivate(QGnomeThemePrivate *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  QGenericUnixThemePrivate *in_stack_ffffffffffffffe0;
  
  *in_RDI = &PTR__QGnomeThemePrivate_00e25538;
  if ((in_RDI[9] != 0) && (pvVar1 = (void *)in_RDI[9], pvVar1 != (void *)0x0)) {
    QFont::~QFont((QFont *)0xae5fea);
    operator_delete(pvVar1,0x10);
  }
  if ((in_RDI[10] != 0) &&
     (in_stack_ffffffffffffffe0 = (QGenericUnixThemePrivate *)in_RDI[10],
     in_stack_ffffffffffffffe0 != (QGenericUnixThemePrivate *)0x0)) {
    QFont::~QFont((QFont *)0xae6025);
    operator_delete(in_stack_ffffffffffffffe0,0x10);
  }
  std::unique_ptr<QDBusPendingCallWatcher,_std::default_delete<QDBusPendingCallWatcher>_>::
  ~unique_ptr((unique_ptr<QDBusPendingCallWatcher,_std::default_delete<QDBusPendingCallWatcher>_> *)
              in_stack_ffffffffffffffe0);
  std::unique_ptr<QDBusListener,_std::default_delete<QDBusListener>_>::~unique_ptr
            ((unique_ptr<QDBusListener,_std::default_delete<QDBusListener>_> *)
             in_stack_ffffffffffffffe0);
  QGenericUnixThemePrivate::~QGenericUnixThemePrivate(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

QGnomeThemePrivate::~QGnomeThemePrivate()
{
    if (systemFont)
        delete systemFont;
    if (fixedFont)
        delete fixedFont;
}